

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_io.cpp
# Opt level: O0

bool __thiscall ON_BrepFaceArray::Write(ON_BrepFaceArray *this,ON_BinaryArchive *file)

{
  ON_BinaryArchive *this_00;
  bool bVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  ON_BrepFace *pOVar5;
  anon_union_4_2_6147a14e_for_ON_Color_15 local_34;
  anon_union_4_2_6147a14e_for_ON_Color_15 local_30;
  byte local_29;
  int local_28;
  int iStack_24;
  bool bHavePerFaceColors;
  int count;
  int minor_version;
  bool rc;
  ON_BinaryArchive *pOStack_18;
  int i;
  ON_BinaryArchive *file_local;
  ON_BrepFaceArray *this_local;
  
  pOStack_18 = file;
  file_local = (ON_BinaryArchive *)this;
  count._3_1_ = ON_BinaryArchive::BeginWrite3dmChunk(file,0x40008000,0);
  if ((bool)count._3_1_) {
    iVar2 = ON_BinaryArchive::Archive3dmVersion(pOStack_18);
    iStack_24 = 1;
    if (0x45 < iVar2) {
      iStack_24 = 2;
    }
    count._3_1_ = ON_BinaryArchive::Write3dmChunkVersion(pOStack_18,1,iStack_24);
    local_28 = ON_ClassArray<ON_BrepFace>::Count((ON_ClassArray<ON_BrepFace> *)this);
    if ((count._3_1_ & 1) != 0) {
      count._3_1_ = ON_BinaryArchive::WriteInt(pOStack_18,local_28);
    }
    for (minor_version = 0; (count._3_1_ & 1) != 0 && minor_version < local_28;
        minor_version = minor_version + 1) {
      if ((count._3_1_ & 1) != 0) {
        pOVar5 = (this->super_ON_ObjectArray<ON_BrepFace>).super_ON_ClassArray<ON_BrepFace>.m_a +
                 minor_version;
        iVar2 = (*(pOVar5->super_ON_SurfaceProxy).super_ON_Surface.super_ON_Geometry.super_ON_Object
                  ._vptr_ON_Object[10])(pOVar5,pOStack_18);
        count._3_1_ = (byte)iVar2 & 1;
      }
    }
    for (minor_version = 0; (count._3_1_ & 1) != 0 && minor_version < local_28;
        minor_version = minor_version + 1) {
      count._3_1_ = ON_BinaryArchive::WriteUuid
                              (pOStack_18,
                               &(this->super_ON_ObjectArray<ON_BrepFace>).
                                super_ON_ClassArray<ON_BrepFace>.m_a[minor_version].m_face_uuid);
    }
    if (((count._3_1_ & 1) != 0) && (1 < iStack_24)) {
      local_29 = 0;
      for (minor_version = 0; (count._3_1_ & 1) != 0 && minor_version < local_28;
          minor_version = minor_version + 1) {
        uVar3 = ON_Color::operator_cast_to_unsigned_int(&ON_Color::UnsetColor);
        local_30 = (anon_union_4_2_6147a14e_for_ON_Color_15)
                   ON_BrepFace::PerFaceColor
                             ((this->super_ON_ObjectArray<ON_BrepFace>).
                              super_ON_ClassArray<ON_BrepFace>.m_a + minor_version);
        uVar4 = ON_Color::operator_cast_to_unsigned_int((ON_Color *)&local_30);
        if (uVar3 != uVar4) {
          local_29 = 1;
          break;
        }
      }
      count._3_1_ = ON_BinaryArchive::WriteBool(pOStack_18,(bool)(local_29 & 1));
      if (((bool)count._3_1_) && ((local_29 & 1) != 0)) {
        for (minor_version = 0; this_00 = pOStack_18,
            (bool)count._3_1_ != false && minor_version < local_28;
            minor_version = minor_version + 1) {
          local_34 = (anon_union_4_2_6147a14e_for_ON_Color_15)
                     ON_BrepFace::PerFaceColor
                               ((this->super_ON_ObjectArray<ON_BrepFace>).
                                super_ON_ClassArray<ON_BrepFace>.m_a + minor_version);
          count._3_1_ = ON_BinaryArchive::WriteColor(this_00,(ON_Color *)&local_34);
        }
      }
    }
    bVar1 = ON_BinaryArchive::EndWrite3dmChunk(pOStack_18);
    if (!bVar1) {
      count._3_1_ = 0;
    }
  }
  return (bool)(count._3_1_ & 1);
}

Assistant:

bool ON_BrepFaceArray::Write( ON_BinaryArchive& file ) const
{
  int i;
  bool rc = file.BeginWrite3dmChunk( TCODE_ANONYMOUS_CHUNK, 0 );
  if (rc) 
  {
    // 1.1 added m_face_uuid
    // 1.2 added m_per_face_color
    const int minor_version = file.Archive3dmVersion() >= 70 ? 2 : 1;
    rc = file.Write3dmChunkVersion(1, minor_version);

    // chunk version 1.0 and later
    const int count = Count();
    if (rc) rc = file.WriteInt( count );
    for ( i = 0; rc && i < count; i++ ) 
    {
      if (rc) rc = m_a[i].Write(file);
    }

    // chunk version 1.1 and later
    for ( i = 0; rc && i < count; i++ )
    {
      rc = file.WriteUuid( m_a[i].m_face_uuid );
    }

    if (rc && minor_version >= 2)
    {
      // 1.2 added optional per face colors
      bool bHavePerFaceColors = false;
      for (i = 0; rc && i < count; i++)
      {
        if (ON_Color::UnsetColor != m_a[i].PerFaceColor())
        {
          bHavePerFaceColors = true;
          break;
        }
      }

      rc = file.WriteBool(bHavePerFaceColors);
      if (rc && bHavePerFaceColors)
      {
        for (i = 0; rc && i < count; i++)
          rc = file.WriteColor(m_a[i].PerFaceColor());
      }
    }

    if ( !file.EndWrite3dmChunk() )
      rc = false;
  }
  return rc;
}